

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CExpressionList *expression)

{
  CExpressionList *pCVar1;
  ulong uVar2;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar3;
  size_type sVar4;
  const_reference this_00;
  pointer pCVar5;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  int local_30;
  int i;
  CExpressionList *local_20;
  CExpressionList *newExpressionList;
  CExpressionList *expression_local;
  CCallSimplifierVisitor *this_local;
  
  newExpressionList = expression;
  expression_local = (CExpressionList *)this;
  pCVar1 = (CExpressionList *)operator_new(0x20);
  CExpressionList::CExpressionList(pCVar1,(CExpression *)0x0);
  local_30 = 0;
  local_20 = pCVar1;
  while( true ) {
    uVar2 = (ulong)local_30;
    pvVar3 = CExpressionList::getExpressions(newExpressionList);
    sVar4 = std::
            vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
            ::size(pvVar3);
    if (sVar4 <= uVar2) break;
    pvVar3 = CExpressionList::getExpressions(newExpressionList);
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ::operator[](pvVar3,(long)local_30);
    pCVar5 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
             operator->(this_00);
    (**(pCVar5->super_IExpression).super_INode._vptr_INode)(pCVar5,this);
    pCVar1 = local_20;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_38,&this->childExpression);
    CExpressionList::Add(pCVar1,&local_38);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_38);
    local_30 = local_30 + 1;
  }
  std::unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>::
  unique_ptr<std::default_delete<IRT::CExpressionList_const>,void>
            ((unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>
              *)&local_40,local_20);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  operator=(&this->childExpressionList,&local_40);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_40);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CExpressionList &expression) {
    CExpressionList* newExpressionList = new CExpressionList();
    for (int i = 0; i < expression.getExpressions().size(); ++i) {
        expression.getExpressions()[i]->Accept(*this);
        newExpressionList->Add(std::move(childExpression));
    }

    childExpressionList = std::move(
            std::unique_ptr<const CExpressionList>(
                    newExpressionList
            )
    );
}